

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_EmbeddedFile::LoadFromBuffer(ON_EmbeddedFile *this,ON_Buffer *buf)

{
  CImpl *pCVar1;
  ON__UINT64 OVar2;
  pointer buffer;
  bool bVar3;
  Data *d;
  ON_Buffer *buf_local;
  ON_EmbeddedFile *this_local;
  
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x21])();
  pCVar1 = this->m_impl;
  OVar2 = ON_Buffer::Size(buf);
  CImpl::Data::SetLength(&pCVar1->m_data,OVar2);
  OVar2 = (pCVar1->m_data).m_length;
  buffer = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&(pCVar1->m_data).m_buffer);
  OVar2 = ON_Buffer::Read(buf,OVar2,buffer);
  bVar3 = OVar2 != (pCVar1->m_data).m_length;
  if (bVar3) {
    (this->m_impl->m_data).m_error = true;
  }
  this_local._7_1_ = !bVar3;
  return this_local._7_1_;
}

Assistant:

bool ON_EmbeddedFile::LoadFromBuffer(ON_Buffer& buf)
{
  Clear();

  // Allocate a buffer for the data.
  auto& d = m_impl->m_data;
  d.SetLength(size_t(buf.Size()));

  // Load the buffer from 'buf'.
  if (buf.Read(d.m_length, d.m_buffer.get()) == d.m_length)
    return true;

  m_impl->m_data.m_error = true;

  return false;
}